

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O1

void __thiscall DNSResolve::ParseHosts(DNSResolve *this)

{
  byte bVar1;
  long *plVar2;
  mapped_type *pmVar3;
  char *p;
  byte *pbVar4;
  string ip;
  string hostname;
  ifstream fhost;
  char host_path [260];
  char line [400];
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518 [16];
  key_type local_508;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_4e8;
  long local_4e0 [65];
  char local_2d8 [272];
  byte local_1c8 [408];
  
  builtin_strncpy(local_2d8,"/etc/hosts",0xb);
  std::ifstream::ifstream(local_4e0,local_2d8,_S_in);
  local_4e8 = &this->hosts_;
LAB_0011156d:
  std::ios::widen((char)*(undefined8 *)(local_4e0[0] + -0x18) + (char)local_4e0);
  plVar2 = (long *)std::istream::getline((char *)local_4e0,(long)local_1c8,-0x70);
  pbVar4 = local_1c8;
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
    std::ifstream::close();
    std::ifstream::~ifstream(local_4e0);
    return;
  }
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) break;
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 0x23) goto LAB_0011156d;
      goto LAB_001115d0;
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
  if (bVar1 == 0) goto LAB_0011156d;
LAB_001115d0:
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508._M_string_length = 0;
  local_508.field_2._M_local_buf[0] = '\0';
  local_528 = local_518;
  local_520 = 0;
  local_518[0] = 0;
  for (; bVar1 = *pbVar4, bVar1 != 0; pbVar4 = pbVar4 + 1) {
    if ((bVar1 == 0x20) || (bVar1 == 9)) goto LAB_0011161c;
    std::__cxx11::string::push_back((char)&local_528);
  }
LAB_00111670:
  if (local_528 != local_518) {
    operator_delete(local_528);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  goto LAB_0011156d;
LAB_0011161c:
  for (; (bVar1 = *pbVar4, bVar1 == 9 || (bVar1 == 0x20)); pbVar4 = pbVar4 + 1) {
  }
  if (bVar1 != 0) {
    while ((0x20 < (ulong)*pbVar4 || ((0x100000201U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
      pbVar4 = pbVar4 + 1;
      std::__cxx11::string::push_back((char)&local_508);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_4e8,&local_508);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  goto LAB_00111670;
}

Assistant:

void DNSResolve::ParseHosts()
{
    char host_path[260];
#ifdef _WIN32
    GetWindowsDirectoryA(host_path, 260);
    strcat(host_path, "\\system32\\drivers\\etc\\hosts");
#else
    strcpy(host_path, "/etc/hosts");
#endif
    ifstream fhost(host_path);
    char line[400];
    while (fhost.getline(line, 400))
    {
        char* p = line;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0' || *p == '#') continue;
        string hostname, ip;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            ip.push_back(*p++);
        }
        if (*p == '\0') continue;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0') continue;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            hostname.push_back(*p++);
        }
        hosts_[hostname] = ip;
    }
    fhost.close();
}